

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O1

void __thiscall Pcode::~Pcode(Pcode *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_comment)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_comment).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_num3)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_num3).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_num2)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_num2).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_num1)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_num1).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Pcode(PcodeType op, string num1, string num2, string num3) : m_op(op), m_num1(num1), m_num2(num2), m_num3(num3) {
        m_comment = string("");
    }